

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_4_channels_with_n_coeffs_mod1
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  float *pfVar5;
  __m128 cs;
  __m128 c;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *pfStack_428;
  int n;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_408;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_2bc;
  float fStack_2b0;
  float fStack_2a4;
  float local_298;
  float fStack_27c;
  float fStack_270;
  float fStack_264;
  float local_258;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  
  decode = output_buffer;
  pfStack_408 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar5 = decode_buffer + ((int)*horizontal_coefficients_local << 2);
    hc._4_4_ = (int)(~(uint)*horizontal_coefficients_local + (int)horizontal_coefficients_local[1])
               >> 2;
    tot0._8_8_ = pfStack_408;
    local_258 = (float)*(undefined8 *)pfStack_408;
    local_148 = (float)*(undefined8 *)pfVar5;
    fStack_144 = (float)((ulong)*(undefined8 *)pfVar5 >> 0x20);
    fStack_140 = (float)*(undefined8 *)(pfVar5 + 2);
    fStack_13c = (float)((ulong)*(undefined8 *)(pfVar5 + 2) >> 0x20);
    fStack_264 = (float)((ulong)*(undefined8 *)pfStack_408 >> 0x20);
    local_168 = (float)*(undefined8 *)(pfVar5 + 4);
    fStack_164 = (float)((ulong)*(undefined8 *)(pfVar5 + 4) >> 0x20);
    fStack_160 = (float)*(undefined8 *)(pfVar5 + 6);
    fStack_15c = (float)((ulong)*(undefined8 *)(pfVar5 + 6) >> 0x20);
    fStack_270 = (float)*(undefined8 *)(pfStack_408 + 2);
    local_188 = (float)*(undefined8 *)(pfVar5 + 8);
    fStack_184 = (float)((ulong)*(undefined8 *)(pfVar5 + 8) >> 0x20);
    fStack_180 = (float)*(undefined8 *)(pfVar5 + 10);
    fStack_17c = (float)((ulong)*(undefined8 *)(pfVar5 + 10) >> 0x20);
    tot1[2] = local_258 * local_148 + fStack_270 * local_188;
    tot1[3] = local_258 * fStack_144 + fStack_270 * fStack_184;
    tot0[0] = local_258 * fStack_140 + fStack_270 * fStack_180;
    tot0[1] = local_258 * fStack_13c + fStack_270 * fStack_17c;
    fStack_27c = (float)((ulong)*(undefined8 *)(pfStack_408 + 2) >> 0x20);
    local_1a8 = (float)*(undefined8 *)(pfVar5 + 0xc);
    fStack_1a4 = (float)((ulong)*(undefined8 *)(pfVar5 + 0xc) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(pfVar5 + 0xe);
    fStack_19c = (float)((ulong)*(undefined8 *)(pfVar5 + 0xe) >> 0x20);
    c[2] = fStack_264 * local_168 + fStack_27c * local_1a8;
    c[3] = fStack_264 * fStack_164 + fStack_27c * fStack_1a4;
    tot1[0] = fStack_264 * fStack_160 + fStack_27c * fStack_1a0;
    tot1[1] = fStack_264 * fStack_15c + fStack_27c * fStack_19c;
    puVar4 = (undefined8 *)tot0._8_8_;
    do {
      pfStack_428 = pfVar5;
      tot0._8_8_ = puVar4;
      uVar2 = *(undefined8 *)(tot0._8_8_ + 0x10);
      local_298 = (float)uVar2;
      uVar3 = *(undefined8 *)(pfStack_428 + 0x10);
      local_1c8 = (float)uVar3;
      fStack_1c4 = (float)((ulong)uVar3 >> 0x20);
      fStack_1c0 = (float)*(undefined8 *)(pfStack_428 + 0x12);
      fStack_1bc = (float)((ulong)*(undefined8 *)(pfStack_428 + 0x12) >> 0x20);
      fStack_2a4 = (float)((ulong)uVar2 >> 0x20);
      local_1e8 = (float)*(undefined8 *)(pfStack_428 + 0x14);
      fStack_1e4 = (float)((ulong)*(undefined8 *)(pfStack_428 + 0x14) >> 0x20);
      fStack_1e0 = (float)*(undefined8 *)(pfStack_428 + 0x16);
      fStack_1dc = (float)((ulong)*(undefined8 *)(pfStack_428 + 0x16) >> 0x20);
      fStack_2b0 = (float)*(undefined8 *)(tot0._8_8_ + 0x18);
      local_208 = (float)*(undefined8 *)(pfStack_428 + 0x18);
      fStack_204 = (float)((ulong)*(undefined8 *)(pfStack_428 + 0x18) >> 0x20);
      fStack_200 = (float)*(undefined8 *)(pfStack_428 + 0x1a);
      fStack_1fc = (float)((ulong)*(undefined8 *)(pfStack_428 + 0x1a) >> 0x20);
      tot1[2] = tot1[2] + local_298 * local_1c8 + fStack_2b0 * local_208;
      tot1[3] = tot1[3] + local_298 * fStack_1c4 + fStack_2b0 * fStack_204;
      tot0[0] = tot0[0] + local_298 * fStack_1c0 + fStack_2b0 * fStack_200;
      tot0[1] = tot0[1] + local_298 * fStack_1bc + fStack_2b0 * fStack_1fc;
      fStack_2bc = (float)((ulong)*(undefined8 *)(tot0._8_8_ + 0x18) >> 0x20);
      local_228 = (float)*(undefined8 *)(pfStack_428 + 0x1c);
      fStack_224 = (float)((ulong)*(undefined8 *)(pfStack_428 + 0x1c) >> 0x20);
      fStack_220 = (float)*(undefined8 *)(pfStack_428 + 0x1e);
      fStack_21c = (float)((ulong)*(undefined8 *)(pfStack_428 + 0x1e) >> 0x20);
      c[2] = c[2] + fStack_2a4 * local_1e8 + fStack_2bc * local_228;
      c[3] = c[3] + fStack_2a4 * fStack_1e4 + fStack_2bc * fStack_224;
      tot1[0] = tot1[0] + fStack_2a4 * fStack_1e0 + fStack_2bc * fStack_220;
      tot1[1] = tot1[1] + fStack_2a4 * fStack_1dc + fStack_2bc * fStack_21c;
      hc._4_4_ = hc._4_4_ + -1;
      puVar4 = (undefined8 *)(tot0._8_8_ + 0x10);
      pfVar5 = pfStack_428 + 0x10;
    } while (0 < hc._4_4_);
    fVar1 = *(float *)(tot0._8_8_ + 0x20);
    local_248 = (float)*(undefined8 *)(pfStack_428 + 0x20);
    fStack_244 = (float)((ulong)*(undefined8 *)(pfStack_428 + 0x20) >> 0x20);
    fStack_240 = (float)*(undefined8 *)(pfStack_428 + 0x22);
    fStack_23c = (float)((ulong)*(undefined8 *)(pfStack_428 + 0x22) >> 0x20);
    *(ulong *)decode =
         CONCAT44(tot1[3] + fVar1 * fStack_244 + c[3],tot1[2] + fVar1 * local_248 + c[2]);
    *(ulong *)(decode + 2) =
         CONCAT44(tot0[1] + fVar1 * fStack_23c + tot1[1],tot0[0] + fVar1 * fStack_240 + tot1[0]);
    pfStack_408 = pfStack_408 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 4;
  } while (decode < output_buffer + (output_sub_size << 2));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod1 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 5 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__1_coeff_remnant( 4 );
    stbir__store_output();
  } while ( output < output_end );
}